

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

schar print_dungeon(boolean bymenu,schar *rlev,xchar *rdgn)

{
  nh_menuitem *pnVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  xchar xVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  undefined7 in_register_00000039;
  nh_menuitem_role nVar10;
  dungeon *pdVar11;
  s_level *psVar12;
  trap *ptVar13;
  int iVar14;
  branch *pbVar15;
  menulist menu;
  int selected [1];
  char buf [256];
  menulist local_770;
  undefined4 local_75c;
  int local_758;
  int local_754;
  schar *local_750;
  xchar *local_748;
  dungeon *local_740;
  char local_738 [14];
  undefined8 uStack_72a;
  lchoice local_638;
  
  local_750 = rlev;
  local_748 = rdgn;
  init_menulist(&local_770);
  local_75c = (undefined4)CONCAT71(in_register_00000039,bymenu);
  if (bymenu != '\0') {
    local_638.idx = 0;
    local_638.menuletter = 'a';
  }
  if (0 < n_dgns) {
    local_758 = (int)bymenu;
    iVar14 = 0;
    pdVar11 = dungeons;
    do {
      cVar2 = pdVar11->num_dunlevs;
      if (cVar2 < 2) {
        sprintf(local_738,"%s: level %d",pdVar11,(ulong)(uint)pdVar11->depth_start);
      }
      else {
        sprintf(local_738,"%s: levels %d to %d",pdVar11,(ulong)(uint)pdVar11->depth_start,
                (ulong)(((int)cVar2 + pdVar11->depth_start) - 1));
      }
      if (pdVar11->entry_lev != '\x01') {
        if (pdVar11->entry_lev == cVar2) {
          sVar6 = strlen(local_738);
          *(undefined8 *)((long)&uStack_72a + sVar6) = 0x776f6c6562206d;
          builtin_strncpy(local_738 + sVar6,", entrance from ",0x10);
        }
        else {
          pcVar8 = eos(local_738);
          sprintf(pcVar8,", entrance on %d",
                  (ulong)(((int)pdVar11->entry_lev + pdVar11->depth_start) - 1));
        }
      }
      if ((char)local_75c == '\0') {
        nVar10 = MI_TEXT;
      }
      else {
        nVar10 = MI_HEADING;
      }
      lVar7 = (long)local_770.size;
      local_740 = pdVar11;
      if (local_770.size <= local_770.icount) {
        local_770.size = local_770.size * 2;
        local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
      }
      pnVar1 = local_770.items + local_770.icount;
      pnVar1->id = 0;
      pnVar1->role = nVar10;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_738);
      local_770.icount = local_770.icount + 1;
      iVar9 = 0;
      psVar12 = sp_levchn;
      while( true ) {
        if (psVar12 == (s_level *)0x0) break;
        if (iVar14 == (psVar12->dlevel).dnum) {
          print_branch(&local_770,iVar14,iVar9,(int)(psVar12->dlevel).dlevel,(boolean)local_758,
                       &local_638);
          sprintf(local_738,"   %s: %d",psVar12->proto,
                  (ulong)(uint)(int)(char)((char)dungeons[(psVar12->dlevel).dnum].depth_start +
                                           (psVar12->dlevel).dlevel + -1));
          if (((psVar12->dlevel).dnum == dungeon_topology.d_stronghold_level.dnum) &&
             ((psVar12->dlevel).dlevel == dungeon_topology.d_stronghold_level.dlevel)) {
            pcVar8 = eos(local_738);
            sprintf(pcVar8," (tune %s)",tune);
          }
          if ((char)local_75c == '\0') {
            lVar7 = (long)local_770.size;
            if (local_770.size <= local_770.icount) {
              local_770.size = local_770.size * 2;
              local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
            }
            pnVar1 = local_770.items + local_770.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_TEXT;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,local_738);
          }
          else {
            if ((iVar14 == dungeon_topology.d_advcal_level.dnum) ||
               (iVar14 == dungeon_topology.d_knox_level.dnum)) {
              local_638.lev[local_638.idx] =
                   (char)dungeons[(psVar12->dlevel).dnum].depth_start + (psVar12->dlevel).dlevel +
                   -1;
              xVar5 = '\0';
            }
            else {
              local_638.lev[local_638.idx] = (psVar12->dlevel).dlevel;
              xVar5 = (xchar)iVar14;
            }
            local_638.dgn[local_638.idx] = xVar5;
            local_638.playerlev[local_638.idx] =
                 (char)dungeons[(psVar12->dlevel).dnum].depth_start + (psVar12->dlevel).dlevel + -1;
            lVar7 = (long)local_770.size;
            if (local_770.size <= local_770.icount) {
              local_770.size = local_770.size * 2;
              local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
            }
            cVar2 = local_638.menuletter;
            iVar9 = local_638.idx + 1;
            pnVar1 = local_770.items + local_770.icount;
            pnVar1->id = iVar9;
            pnVar1->role = MI_NORMAL;
            pnVar1->accel = local_638.menuletter;
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,local_738);
            local_638.idx = iVar9;
            if (cVar2 == 'z') {
              local_638.menuletter = 'A';
            }
            else if (cVar2 == 'Z') {
              local_638.menuletter = 'a';
            }
            else {
              local_638.menuletter = cVar2 + '\x01';
            }
          }
          local_770.icount = local_770.icount + 1;
          iVar9 = (int)(psVar12->dlevel).dlevel;
        }
        psVar12 = psVar12->next;
      }
      print_branch(&local_770,iVar14,iVar9,0x20,(boolean)local_758,&local_638);
      iVar14 = iVar14 + 1;
      pdVar11 = local_740 + 1;
    } while (iVar14 < n_dgns);
  }
  if (branches != (branch *)0x0) {
    bVar4 = true;
    pbVar15 = branches;
    do {
      if (n_dgns == (pbVar15->end1).dnum) {
        if (bVar4) {
          if ((char)local_75c != '\0') {
            pcVar8 = " (unknown)";
            if ((ulong)(uint)pbVar15->type < 4) {
              pcVar8 = (&PTR_anon_var_dwarf_4e33a_00304e10)[(uint)pbVar15->type];
            }
            bVar4 = false;
            sprintf(local_738,"   %s to %s",pcVar8,dungeons + (pbVar15->end2).dnum);
            goto LAB_0018d193;
          }
          lVar7 = (long)local_770.size;
          if (local_770.size <= local_770.icount) {
            local_770.size = local_770.size * 2;
            local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
          }
          lVar7 = (long)local_770.icount;
          local_770.items[lVar7].accel = '\0';
          local_770.items[lVar7].group_accel = '\0';
          local_770.items[lVar7].selected = '\0';
          local_770.items[lVar7].caption[0] = '\0';
          local_770.items[lVar7].id = 0;
          local_770.items[lVar7].role = MI_TEXT;
          local_770.icount = local_770.icount + 1;
          lVar7 = (long)local_770.size;
          if (local_770.size <= local_770.icount) {
            local_770.size = local_770.size * 2;
            local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
          }
          lVar7 = (long)local_770.icount;
          local_770.items[lVar7].id = 0;
          local_770.items[lVar7].role = MI_TEXT;
          local_770.items[lVar7].accel = '\0';
          local_770.items[lVar7].group_accel = '\0';
          local_770.items[lVar7].selected = '\0';
          builtin_strncpy(local_770.items[lVar7].caption,"Floating branche",0x10);
          local_770.items[lVar7].caption[0x10] = 's';
          local_770.items[lVar7].caption[0x11] = '\0';
          local_770.icount = local_770.icount + 1;
        }
        pcVar8 = " (unknown)";
        if ((ulong)(uint)pbVar15->type < 4) {
          pcVar8 = (&PTR_anon_var_dwarf_4e33a_00304e10)[(uint)pbVar15->type];
        }
        bVar4 = false;
        sprintf(local_738,"   %s to %s",pcVar8,dungeons + (pbVar15->end2).dnum);
        if ((char)local_75c == '\0') {
          lVar7 = (long)local_770.size;
          if (local_770.size <= local_770.icount) {
            local_770.size = local_770.size * 2;
            local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
          }
          pnVar1 = local_770.items + local_770.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_738);
          local_770.icount = local_770.icount + 1;
          bVar4 = false;
        }
      }
LAB_0018d193:
      pbVar15 = pbVar15->next;
    } while (pbVar15 != (branch *)0x0);
  }
  if ((char)local_75c != '\0') {
    iVar14 = display_menu(local_770.items,local_770.icount,"Level teleport to where:",1,&local_754);
    free(local_770.items);
    if ((0 < iVar14) && (local_748 != (xchar *)0x0 && local_750 != (schar *)0x0)) {
      lVar7 = (long)local_754;
      *local_750 = local_638.lev[lVar7 + -1];
      *local_748 = local_638.dgn[lVar7 + -1];
      return local_638.playerlev[lVar7 + -1];
    }
    return '\0';
  }
  if ((((uint)dungeons[u.uz.dnum].flags & 2) == 0) ||
     (dungeons[u.uz.dnum].num_dunlevs + -1 != (int)u.uz.dlevel)) {
    if (((((u.uz.dnum != dungeon_topology.d_earth_level.dnum) ||
          (u.uz.dlevel != dungeon_topology.d_earth_level.dlevel)) &&
         ((u.uz.dnum != dungeon_topology.d_water_level.dnum ||
          (u.uz.dlevel != dungeon_topology.d_water_level.dlevel)))) &&
        ((u.uz.dnum != dungeon_topology.d_fire_level.dnum ||
         (u.uz.dlevel != dungeon_topology.d_fire_level.dlevel)))) &&
       ((u.uz.dnum != dungeon_topology.d_air_level.dnum ||
        (u.uz.dlevel != dungeon_topology.d_air_level.dlevel)))) goto LAB_0018d434;
    ptVar13 = (trap *)&level->lev_traps;
    do {
      ptVar13 = ptVar13->ntrap;
      if (ptVar13 == (trap *)0x0) break;
    } while ((ptVar13->field_0x8 & 0x1f) != 0x12);
    lVar7 = (long)local_770.size;
    if (local_770.size <= local_770.icount) {
      local_770.size = local_770.size * 2;
      local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_770.icount;
    local_770.items[lVar7].accel = '\0';
    local_770.items[lVar7].group_accel = '\0';
    local_770.items[lVar7].selected = '\0';
    local_770.items[lVar7].caption[0] = '\0';
    local_770.items[lVar7].id = 0;
    local_770.items[lVar7].role = MI_TEXT;
    local_770.icount = local_770.icount + 1;
    if (ptVar13 != (trap *)0x0) {
      cVar2 = ptVar13->tx;
      cVar3 = ptVar13->ty;
      pcVar8 = "Portal @ (%d,%d), hero @ (%d,%d)";
      goto LAB_0018d3ae;
    }
    builtin_strncpy(local_738,"No portal foun",0xe);
    uStack_72a._0_1_ = 'd';
    uStack_72a._1_1_ = '.';
    uStack_72a._2_1_ = 0;
  }
  else {
    lVar7 = (long)local_770.size;
    if (local_770.size <= local_770.icount) {
      local_770.size = local_770.size * 2;
      local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
    }
    lVar7 = (long)local_770.icount;
    local_770.items[lVar7].accel = '\0';
    local_770.items[lVar7].group_accel = '\0';
    local_770.items[lVar7].selected = '\0';
    local_770.items[lVar7].caption[0] = '\0';
    local_770.items[lVar7].id = 0;
    local_770.items[lVar7].role = MI_TEXT;
    local_770.icount = local_770.icount + 1;
    pcVar8 = "Invocation position @ (%d,%d), hero @ (%d,%d)";
    cVar3 = inv_pos.y;
    cVar2 = inv_pos.x;
LAB_0018d3ae:
    sprintf(local_738,pcVar8,(ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3,(ulong)(uint)(int)u.ux,
            (ulong)(uint)(int)u.uy);
  }
  lVar7 = (long)local_770.size;
  if (local_770.size <= local_770.icount) {
    local_770.size = local_770.size * 2;
    local_770.items = (nh_menuitem *)realloc(local_770.items,lVar7 * 0x218);
  }
  pnVar1 = local_770.items + local_770.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_738);
  local_770.icount = local_770.icount + 1;
LAB_0018d434:
  display_menu(local_770.items,local_770.icount,"Level teleport to where:",0,(int *)0x0);
  free(local_770.items);
  return '\0';
}

Assistant:

schar print_dungeon(boolean bymenu, schar *rlev, xchar *rdgn)
{
    int     i, last_level, nlev;
    char    buf[BUFSZ];
    boolean first;
    s_level *slev;
    dungeon *dptr;
    branch  *br;
    struct lchoice lchoices;
    struct menulist menu;
    
    init_menulist(&menu);

    if (bymenu) {
	lchoices.idx = 0;
	lchoices.menuletter = 'a';
    }

    for (i = 0, dptr = dungeons; i < n_dgns; i++, dptr++) {
	nlev = dptr->num_dunlevs;
	if (nlev > 1)
	    sprintf(buf, "%s: levels %d to %d", dptr->dname, dptr->depth_start,
						dptr->depth_start + nlev - 1);
	else
	    sprintf(buf, "%s: level %d", dptr->dname, dptr->depth_start);

	/* Most entrances are uninteresting. */
	if (dptr->entry_lev != 1) {
	    if (dptr->entry_lev == nlev)
		strcat(buf, ", entrance from below");
	    else
		sprintf(eos(buf), ", entrance on %d",
			dptr->depth_start + dptr->entry_lev - 1);
	}
	if (bymenu) {
	    add_menuheading(&menu, buf);
	} else
	    add_menutext(&menu, buf);

	/*
	 * Circle through the special levels to find levels that are in
	 * this dungeon.
	 */
	for (slev = sp_levchn, last_level = 0; slev; slev = slev->next) {
	    if (slev->dlevel.dnum != i)
		continue;

	    /* print any branches before this level */
	    print_branch(&menu, i, last_level, slev->dlevel.dlevel,
			 bymenu, &lchoices);

	    sprintf(buf, "   %s: %d", slev->proto, depth(&slev->dlevel));
	    if (Is_stronghold(&slev->dlevel))
		sprintf(eos(buf), " (tune %s)", tune);
	    if (bymenu) {
		/* If other floating branches are added, this will need to change */
		if (i != advcal_level.dnum && i != knox_level.dnum) {
			lchoices.lev[lchoices.idx] = slev->dlevel.dlevel;
			lchoices.dgn[lchoices.idx] = i;
		} else {
			lchoices.lev[lchoices.idx] = depth(&slev->dlevel);
			lchoices.dgn[lchoices.idx] = 0;
		}
		lchoices.playerlev[lchoices.idx] = depth(&slev->dlevel);
		
		add_menuitem(&menu, lchoices.idx + 1, buf, lchoices.menuletter, FALSE);
		if (lchoices.menuletter == 'z') lchoices.menuletter = 'A';
		else if (lchoices.menuletter == 'Z') lchoices.menuletter = 'a';
		else lchoices.menuletter++;
		lchoices.idx++;
	    } else
		add_menutext(&menu, buf);

	    last_level = slev->dlevel.dlevel;
	}
	/* print branches after the last special level */
	print_branch(&menu, i, last_level, MAXLEVEL, bymenu, &lchoices);
    }

    /* Print out floating branches (if any). */
    for (first = TRUE, br = branches; br; br = br->next) {
	if (br->end1.dnum == n_dgns) {
	    if (first) {
	    	if (!bymenu) {
		    add_menutext(&menu, "");
		    add_menutext(&menu, "Floating branches");
		}
		first = FALSE;
	    }
	    sprintf(buf, "   %s to %s",
			br_string(br->type), dungeons[br->end2.dnum].dname);
	    if (!bymenu)
		add_menutext(&menu, buf);
	}
    }
    
    if (bymenu) {
    	int n;
	int selected[1];
	int idx;
	
	n = display_menu(menu.items, menu.icount, "Level teleport to where:",
			 PICK_ONE, selected);
	free(menu.items);
	if (n > 0) {
		idx = selected[0] - 1;
		if (rlev && rdgn) {
			*rlev = lchoices.lev[idx];
			*rdgn = lchoices.dgn[idx];
			return lchoices.playerlev[idx];
		}
	}
	return 0;
    }

    /* I hate searching for the invocation pos while debugging. -dean */
    if (Invocation_lev(&u.uz)) {
	add_menutext(&menu, "");
	sprintf(buf, "Invocation position @ (%d,%d), hero @ (%d,%d)",
		inv_pos.x, inv_pos.y, u.ux, u.uy);
	add_menutext(&menu, buf);
    }
    /*
     * The following is based on the assumption that the inter-level portals
     * created by the level compiler (not the dungeon compiler) only exist
     * one per level (currently true, of course).
     */
    else if (Is_earthlevel(&u.uz) || Is_waterlevel(&u.uz)
				|| Is_firelevel(&u.uz) || Is_airlevel(&u.uz)) {
	struct trap *trap;
	for (trap = level->lev_traps; trap; trap = trap->ntrap)
	    if (trap->ttyp == MAGIC_PORTAL)
		break;

	add_menutext(&menu, "");
	if (trap)
	    sprintf(buf, "Portal @ (%d,%d), hero @ (%d,%d)",
		trap->tx, trap->ty, u.ux, u.uy);
	else
	    sprintf(buf, "No portal found.");
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "Level teleport to where:", PICK_NONE, NULL);
    free(menu.items);
    return 0;
}